

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AddLinkDirectory(cmMakefile *this,string *directory,bool before)

{
  cmListFileBacktrace local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_110;
  cmStateDirectory local_e0;
  cmListFileBacktrace local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_78;
  cmStateDirectory local_48;
  undefined1 local_19;
  string *psStack_18;
  bool before_local;
  string *directory_local;
  cmMakefile *this_local;
  
  local_19 = before;
  psStack_18 = directory;
  directory_local = (string *)this;
  if (before) {
    cmStateSnapshot::GetDirectory(&local_48,&this->StateSnapshot);
    std::__cxx11::string::string((string *)&local_98,(string *)psStack_18);
    cmListFileBacktrace::cmListFileBacktrace(&local_a8,&this->Backtrace);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_78,&local_98,&local_a8);
    cmStateDirectory::PrependLinkDirectoriesEntry(&local_48,&local_78);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_78);
    cmListFileBacktrace::~cmListFileBacktrace(&local_a8);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    cmStateSnapshot::GetDirectory(&local_e0,&this->StateSnapshot);
    std::__cxx11::string::string((string *)&local_130,(string *)psStack_18);
    cmListFileBacktrace::cmListFileBacktrace(&local_140,&this->Backtrace);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_110,&local_130,&local_140);
    cmStateDirectory::AppendLinkDirectoriesEntry(&local_e0,&local_110);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_110);
    cmListFileBacktrace::~cmListFileBacktrace(&local_140);
    std::__cxx11::string::~string((string *)&local_130);
  }
  return;
}

Assistant:

void cmMakefile::AddLinkDirectory(std::string const& directory, bool before)
{
  if (before) {
    this->StateSnapshot.GetDirectory().PrependLinkDirectoriesEntry(
      BT<std::string>(directory, this->Backtrace));
  } else {
    this->StateSnapshot.GetDirectory().AppendLinkDirectoriesEntry(
      BT<std::string>(directory, this->Backtrace));
  }
}